

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTests.cpp
# Opt level: O2

bool ContainsMacro(Preprocessor *preprocessor,string *macroIdentifier)

{
  pointer pTVar1;
  __type _Var2;
  pointer __lhs;
  long lVar3;
  pointer pTVar4;
  long lVar5;
  TSymTable local_48;
  
  tcpp::Preprocessor::GetSymbolsTable(&local_48,preprocessor);
  pTVar1 = local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                _M_impl.super__Vector_impl_data._M_start;
  __lhs = local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
          super__Vector_impl_data._M_start;
  for (lVar3 = lVar5 / 0x58 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    _Var2 = std::operator==(&__lhs->mName,macroIdentifier);
    pTVar4 = __lhs;
    if (_Var2) goto LAB_0011cc1b;
    _Var2 = std::operator==(&__lhs[1].mName,macroIdentifier);
    pTVar4 = __lhs + 1;
    if (_Var2) goto LAB_0011cc1b;
    _Var2 = std::operator==(&__lhs[2].mName,macroIdentifier);
    pTVar4 = __lhs + 2;
    if (_Var2) goto LAB_0011cc1b;
    _Var2 = std::operator==(&__lhs[3].mName,macroIdentifier);
    pTVar4 = __lhs + 3;
    if (_Var2) goto LAB_0011cc1b;
    __lhs = __lhs + 4;
    lVar5 = lVar5 + -0x160;
  }
  lVar5 = lVar5 / 0x58;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pTVar4 = pTVar1;
      if ((lVar5 != 3) ||
         (_Var2 = std::operator==(&__lhs->mName,macroIdentifier), pTVar4 = __lhs, _Var2))
      goto LAB_0011cc1b;
      __lhs = __lhs + 1;
    }
    _Var2 = std::operator==(&__lhs->mName,macroIdentifier);
    pTVar4 = __lhs;
    if (_Var2) goto LAB_0011cc1b;
    __lhs = __lhs + 1;
  }
  _Var2 = std::operator==(&__lhs->mName,macroIdentifier);
  pTVar4 = pTVar1;
  if (_Var2) {
    pTVar4 = __lhs;
  }
LAB_0011cc1b:
  std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::~vector
            ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&local_48);
  return pTVar4 != local_48.super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

static bool ContainsMacro(const Preprocessor& preprocessor, const std::string& macroIdentifier)
{
	const auto& symTable = preprocessor.GetSymbolsTable();

	auto it = std::find_if(symTable.cbegin(), symTable.cend(), [&macroIdentifier](auto&& symTableEntry)
	{
		return symTableEntry.mName == macroIdentifier;
	});

	return it != symTable.cend();
}